

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::taylor_inplace_multiplier<double,_2,_8,_8,_1>::mul(double *p1,double *p2)

{
  double *pdVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  double dVar5;
  
  iVar2 = binomial(9,7);
  iVar3 = binomial(8,6);
  pdVar1 = p1 + iVar2;
  dVar5 = *pdVar1;
  lVar4 = 0;
  do {
    pdVar1[lVar4] = p1[iVar3 + lVar4] * p2[1] + dVar5;
    dVar5 = p1[iVar3 + lVar4] * p2[2] + pdVar1[lVar4 + 1];
    pdVar1[lVar4 + 1] = dVar5;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 8);
  taylor_inplace_multiplier<double,_2,_8,_8,_2>::mul(p1,p2);
  return;
}

Assistant:

static void mul(numtype p1[], const numtype p2[]) {
    if (i2 <= Ndeg2) {
      // M1(Ndeg-i2)*M2(i2) -> M1(Ndeg)
      polynomial_multiplier<numtype, Nvar - 1, Ndeg - i2, i2>::mul(
          p1 + binomial(Nvar + Ndeg - 1, Ndeg - 1),
          p1 + binomial(Nvar + Ndeg - i2 - 1, Ndeg - i2 - 1),
          p2 + binomial(Nvar + i2 - 1, i2 - 1));
    }
    taylor_inplace_multiplier<numtype, Nvar, Ndeg, Ndeg2, i2 + 1> // Back to (2), or
                                                                  // to (3) when i2+1
                                                                  // == Ndeg
        ::mul(p1, p2);
  }